

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dis.h
# Opt level: O2

expr * makebinex(etype type,expr *expr1,expr *expr2)

{
  expr *peVar1;
  uint uVar2;
  
  peVar1 = makeex(type);
  peVar1->expr1 = expr1;
  peVar1->expr2 = expr2;
  if (type - EXPR_SESTART < 0xfffffffe) {
    if (expr1->isimm == 0) {
      uVar2 = 0;
    }
    else {
      uVar2 = (uint)(expr2->isimm != 0);
    }
    peVar1->isimm = uVar2;
  }
  return peVar1;
}

Assistant:

static inline struct expr *makebinex(enum etype type, const struct expr *expr1, const struct expr *expr2) {
	struct expr *res = makeex(type);
	res->expr1 = expr1;
	res->expr2 = expr2;
	if (type != EXPR_PIADD && type != EXPR_PISUB)
		res->isimm = expr1->isimm && expr2->isimm;
	return res;
}